

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_kaku.c
# Opt level: O1

int kaku_send(rf_dev_t *dev,uint8_t *data)

{
  int iVar1;
  undefined1 *puVar2;
  uint8_t uVar3;
  uint uVar4;
  int iVar5;
  timespec ifg_time;
  uint8_t frame_buf [234];
  timespec local_128;
  uint8_t local_118 [9];
  undefined1 local_10f [231];
  
  memset(local_118,0,0xea);
  local_118[0] = 0xff;
  puVar2 = local_10f;
  uVar3 = *data;
  uVar4 = 9;
  do {
    *puVar2 = 0xff;
    if ((char)uVar3 < '\0') {
      *(undefined4 *)(puVar2 + 1) = 0;
      *(undefined2 *)(puVar2 + 5) = 0xff;
    }
    else {
      *(undefined2 *)(puVar2 + 1) = 0xff00;
      *(undefined4 *)(puVar2 + 3) = 0;
    }
    uVar3 = uVar3 * '\x02';
    puVar2 = puVar2 + 7;
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  uVar3 = data[1];
  uVar4 = 9;
  do {
    *puVar2 = 0xff;
    if ((char)uVar3 < '\0') {
      *(undefined4 *)(puVar2 + 1) = 0;
      *(undefined2 *)(puVar2 + 5) = 0xff;
    }
    else {
      *(undefined2 *)(puVar2 + 1) = 0xff00;
      *(undefined4 *)(puVar2 + 3) = 0;
    }
    uVar3 = uVar3 * '\x02';
    puVar2 = puVar2 + 7;
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  uVar3 = data[2];
  uVar4 = 9;
  do {
    *puVar2 = 0xff;
    if ((char)uVar3 < '\0') {
      *(undefined4 *)(puVar2 + 1) = 0;
      *(undefined2 *)(puVar2 + 5) = 0xff;
    }
    else {
      *(undefined2 *)(puVar2 + 1) = 0xff00;
      *(undefined4 *)(puVar2 + 3) = 0;
    }
    uVar3 = uVar3 * '\x02';
    puVar2 = puVar2 + 7;
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  uVar3 = data[3];
  uVar4 = 9;
  do {
    *puVar2 = 0xff;
    if ((char)uVar3 < '\0') {
      *(undefined4 *)(puVar2 + 1) = 0;
      *(undefined2 *)(puVar2 + 5) = 0xff;
    }
    else {
      *(undefined2 *)(puVar2 + 1) = 0xff00;
      *(undefined4 *)(puVar2 + 3) = 0;
    }
    uVar3 = uVar3 * '\x02';
    puVar2 = puVar2 + 7;
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  *puVar2 = 0xff;
  iVar5 = 4;
  do {
    iVar1 = rf_send(dev,local_118,0xea);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_128.tv_sec = 0;
    local_128.tv_nsec = 7700000;
    nanosleep(&local_128,(timespec *)0x0);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return 0;
}

Assistant:

int kaku_send(rf_dev_t *dev, uint8_t data[4])
{
	int ret;
	uint8_t frame_buf[KAKU_FRAME_IVALS];
  	uint8_t *frame_head = frame_buf;

	memset(frame_buf, 0, sizeof(frame_buf));

	// Preamble
	*frame_head = 0xff;
	frame_head += KAKU_PREAMBLE_IVALS;

	// Data
	frame_head = encode_kaku(frame_head, data[0]);
	frame_head = encode_kaku(frame_head, data[1]);
	frame_head = encode_kaku(frame_head, data[2]);
	frame_head = encode_kaku(frame_head, data[3]);

	// Stop bit
	*frame_head = 0xff;

	for (int i=0; i < KAKU_FRAME_REPEAT; i++) {
		ret = rf_send(dev, frame_buf, sizeof(frame_buf));
		if (ret != ERR_OK) {
			return ret;
		}

		// Inter Frame Gap
		struct timespec ifg_time = {
			0, KAKU_INTER_FRAME_GAP_US * 1000
		};
		nanosleep(&ifg_time, NULL);
	}

	return ERR_OK;
}